

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O1

Module * soul::Module::createProcessor(Program *p)

{
  PoolItem *pPVar1;
  
  pPVar1 = PoolAllocator::allocateSpaceForObject(&(p->pimpl->allocator).pool,0x488);
  Module((Module *)&pPVar1->item,p,processorModule);
  pPVar1->destructor =
       PoolAllocator::allocate<soul::Module,_soul::Program_&,_soul::Module::ModuleType>::
       anon_class_1_0_00000001::__invoke;
  return (Module *)&pPVar1->item;
}

Assistant:

Module& Module::createProcessor (Program& p)    { return p.getAllocator().allocate<Module> (p, ModuleType::processorModule); }